

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

VectorXi __thiscall ear::argSort(ear *this,VectorXd *v)

{
  Index IVar1;
  Index IVar2;
  Index extraout_RDX;
  VectorXi VVar3;
  iterator local_78 [2];
  iterator local_58;
  Scalar local_48 [2];
  RandomAccessLinSpacedReturnType local_40;
  undefined1 local_19;
  anon_class_8_1_54a39816 local_18;
  VectorXd *v_local;
  VectorXi *indices;
  
  local_19 = 0;
  local_18.v = v;
  v_local = (VectorXd *)this;
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)v);
  local_48[1] = 0;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_18.v);
  local_48[0] = (Scalar)IVar2;
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::LinSpaced
            (&local_40,(long)(int)IVar1,local_48 + 1,local_48);
  Eigen::Matrix<int,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((Matrix<int,_1,1,0,_1,1> *)this,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
              *)&local_40);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::begin
            (&local_58,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::end
            (local_78,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this);
  std::
  sort<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>
            (&local_58,local_78,local_18);
  VVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  VVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (VectorXi)VVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXi argSort(const Eigen::VectorXd& v) {
    Eigen::VectorXi indices = Eigen::VectorXi::LinSpaced(
        static_cast<int>(v.size()), 0, static_cast<int>(v.size()));
    std::sort(indices.begin(), indices.end(),
              [&v](size_t i1, size_t i2) { return v[i1] < v[i2]; });
    return indices;
  }